

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O2

void toktheach(toktdef *tab1,_func_void_void_ptr_toksdef_ptr *cb,void *ctx)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  errdef fr_;
  errdef local_168;
  
  uVar2 = 0;
  while( true ) {
    if (*(uint *)&tab1[0x2b].tokterr < uVar2) {
      return;
    }
    uVar5 = (ulong)uVar2;
    puVar3 = mcmlck((mcmcxdef *)tab1[1].toktfadd,
                    *(mcmon *)((long)&tab1[0x2b].tokterr + uVar5 * 2 + 4));
    local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
    if (local_168.errcode != 0) break;
    local_168.errprv = tab1->tokterr->errcxptr;
    tab1->tokterr->errcxptr = &local_168;
    if (uVar2 == *(uint *)&tab1[0x2b].tokterr) {
      uVar4 = (uint)*(ushort *)((long)&tab1[0x3c].toktfsea + 2);
    }
    else {
      uVar4 = *(uint *)((long)&tab1[0x31].toktfsea + uVar5 * 4 + 4);
    }
    local_168.errcode = 0;
    for (uVar1 = 0; uVar1 < uVar4; uVar1 = (puVar3[(ulong)uVar1 + 0xe] + 0x17 & 0xfffffff8) + uVar1)
    {
      (*cb)(ctx,(toksdef *)(puVar3 + (ulong)uVar1 + 8));
    }
    tab1->tokterr->errcxptr = local_168.errprv;
    mcmunlck((mcmcxdef *)tab1[1].toktfadd,*(mcmon *)((long)&tab1[0x2b].tokterr + uVar5 * 2 + 4));
    uVar2 = uVar2 + 1;
  }
  tab1->tokterr->errcxptr = local_168.errprv;
  mcmunlck((mcmcxdef *)tab1[1].toktfadd,*(mcmon *)((long)&tab1[0x2b].tokterr + uVar5 * 2 + 4));
  errrse1(tab1->tokterr,&local_168);
}

Assistant:

void toktheach(toktdef *tab1,
               void (*cb)(void *, toksdef *), void *ctx)
{
    tokthdef *tab = (tokthdef *)tab1;
    uchar    *p;
    uint      max;
    uint      ofs;
    tokshdef *symh;
    toksdef  *sym;
    uint      siz;
    uint      i;
    
    for (i = 0 ; i <= tab->tokthpcnt ; ++i)
    {
        /* lock the current page */
        p = mcmlck(tab->tokthmem, tab->tokthpool[i]);
        
        ERRBEGIN(tab1->tokterr)

        max = (i == tab->tokthpcnt ? tab->tokthofs : tab->tokthfinal[i]);
        for (ofs = 0 ; ofs < max ; )
        {
            /* get this symbol */
            symh = (tokshdef *)(p + ofs);
            sym = &symh->tokshsc;
            
            /* call the user callback */
            (*cb)(ctx, sym);
            
            /* advance to the next symbol on this page */
            siz = sizeof(toksh1def) + sym->tokslen;
            ofs += osrndsz(siz);
        }
            
        ERRCLEAN(tab1->tokterr)
            mcmunlck(tab->tokthmem, tab->tokthpool[i]);
        ERRENDCLN(tab1->tokterr)
            
        /* done with current page; unlock it */
        mcmunlck(tab->tokthmem, tab->tokthpool[i]);
    }
}